

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::SetImportLinkProperty<cmLinkItem>
          (cmExportFileGenerator *this,string *suffix,cmGeneratorTarget *target,string *propName,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *entries,ImportPropertyMap *properties,
          ImportLinkPropertyTargetNames targetNames)

{
  bool bVar1;
  reference l_00;
  string *psVar2;
  mapped_type *this_00;
  undefined1 local_d8 [8];
  string prop;
  string temp;
  cmLinkItem *l;
  const_iterator __end0;
  const_iterator __begin0;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range1;
  char *sep;
  string link_entries;
  cmLocalGenerator *lg;
  ImportPropertyMap *properties_local;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *entries_local;
  string *propName_local;
  cmGeneratorTarget *target_local;
  string *suffix_local;
  cmExportFileGenerator *this_local;
  
  bVar1 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::empty(entries);
  if (!bVar1) {
    link_entries.field_2._8_8_ = cmGeneratorTarget::GetLocalGenerator(target);
    std::__cxx11::string::string((string *)&sep);
    __range1 = (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)0x12b2cf7;
    __end0 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(entries);
    l = (cmLinkItem *)std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(entries);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                       *)&l), bVar1) {
      l_00 = __gnu_cxx::
             __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
             ::operator*(&__end0);
      std::__cxx11::string::operator+=((string *)&sep,(char *)__range1);
      __range1 = (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)0x122a286;
      if (targetNames == Yes) {
        psVar2 = asString_abi_cxx11_(l_00);
        std::__cxx11::string::string((string *)(prop.field_2._M_local_buf + 8),(string *)psVar2);
        AddTargetNamespace(this,(string *)((long)&prop.field_2 + 8),target,
                           (cmLocalGenerator *)link_entries.field_2._8_8_);
        std::__cxx11::string::operator+=((string *)&sep,(string *)(prop.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(prop.field_2._M_local_buf + 8));
      }
      else {
        psVar2 = asString_abi_cxx11_(l_00);
        std::__cxx11::string::operator+=((string *)&sep,(string *)psVar2);
      }
      __gnu_cxx::
      __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
      operator++(&__end0);
    }
    cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((string *)local_d8,propName,suffix);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](properties,(key_type *)local_d8);
    std::__cxx11::string::operator=((string *)this_00,(string *)&sep);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string((string *)&sep);
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetImportLinkProperty(
  std::string const& suffix, cmGeneratorTarget const* target,
  const std::string& propName, std::vector<T> const& entries,
  ImportPropertyMap& properties, ImportLinkPropertyTargetNames targetNames)
{
  // Skip the property if there are no entries.
  if (entries.empty()) {
    return;
  }

  cmLocalGenerator const* lg = target->GetLocalGenerator();

  // Construct the property value.
  std::string link_entries;
  const char* sep = "";
  for (T const& l : entries) {
    // Separate this from the previous entry.
    link_entries += sep;
    sep = ";";

    if (targetNames == ImportLinkPropertyTargetNames::Yes) {
      std::string temp = asString(l);
      this->AddTargetNamespace(temp, target, lg);
      link_entries += temp;
    } else {
      link_entries += asString(l);
    }
  }

  // Store the property.
  std::string prop = cmStrCat(propName, suffix);
  properties[prop] = link_entries;
}